

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression * soul::operator+(Expression *__return_storage_ptr__,Expression *a,Expression *b)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference __x;
  Section *s;
  iterator __end1;
  iterator __begin1;
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  *__range1;
  Expression *b_local;
  Expression *a_local;
  
  sVar2 = std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::size(&a->sections);
  sVar3 = std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::size(&b->sections);
  std::
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ::reserve(&a->sections,sVar2 + sVar3);
  __end1 = std::
           vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
           ::begin(&b->sections);
  s = (Section *)
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::end(&b->sections);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
                                *)&s);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
          ::operator*(&__end1);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::push_back(&a->sections,__x);
    __gnu_cxx::
    __normal_iterator<soul::SourceCodeModel::Expression::Section_*,_std::vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>_>
    ::operator++(&__end1);
  }
  SourceCodeModel::Expression::Expression(__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression operator+ (SourceCodeModel::Expression a, SourceCodeModel::Expression&& b)
{
    a.sections.reserve (a.sections.size() + b.sections.size());

    for (auto& s : b.sections)
        a.sections.push_back (std::move (s));

    return a;
}